

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void highbd_hadamard_col8_avx2(__m256i *in,int iter)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  
  auVar1 = vpaddd_avx2((undefined1  [32])in[1],(undefined1  [32])*in);
  auVar7 = vpsubd_avx2((undefined1  [32])*in,(undefined1  [32])in[1]);
  auVar2 = vpaddd_avx2((undefined1  [32])in[3],(undefined1  [32])in[2]);
  auVar8 = vpsubd_avx2((undefined1  [32])in[2],(undefined1  [32])in[3]);
  auVar3 = vpaddd_avx2((undefined1  [32])in[5],(undefined1  [32])in[4]);
  auVar9 = vpsubd_avx2((undefined1  [32])in[4],(undefined1  [32])in[5]);
  auVar4 = vpaddd_avx2((undefined1  [32])in[7],(undefined1  [32])in[6]);
  auVar10 = vpsubd_avx2((undefined1  [32])in[6],(undefined1  [32])in[7]);
  auVar5 = vpaddd_avx2(auVar1,auVar2);
  auVar6 = vpaddd_avx2(auVar8,auVar7);
  auVar11 = vpsubd_avx2(auVar1,auVar2);
  auVar7 = vpsubd_avx2(auVar7,auVar8);
  auVar1 = vpaddd_avx2(auVar3,auVar4);
  auVar2 = vpaddd_avx2(auVar10,auVar9);
  auVar3 = vpsubd_avx2(auVar3,auVar4);
  auVar4 = vpsubd_avx2(auVar9,auVar10);
  alVar12 = (__m256i)vpaddd_avx2(auVar1,auVar5);
  if (iter != 0) {
    *in = alVar12;
    alVar12 = (__m256i)vpaddd_avx2(auVar2,auVar6);
    in[7] = alVar12;
    alVar12 = (__m256i)vpaddd_avx2(auVar3,auVar11);
    in[3] = alVar12;
    alVar12 = (__m256i)vpaddd_avx2(auVar4,auVar7);
    in[4] = alVar12;
    alVar12 = (__m256i)vpsubd_avx2(auVar5,auVar1);
    in[2] = alVar12;
    alVar12 = (__m256i)vpsubd_avx2(auVar6,auVar2);
    in[6] = alVar12;
    alVar12 = (__m256i)vpsubd_avx2(auVar11,auVar3);
    in[1] = alVar12;
    alVar12 = (__m256i)vpsubd_avx2(auVar7,auVar4);
    in[5] = alVar12;
    return;
  }
  auVar8 = vpaddd_avx2(auVar2,auVar6);
  auVar9 = vpaddd_avx2(auVar3,auVar11);
  auVar10 = vpaddd_avx2(auVar4,auVar7);
  auVar1 = vpsubd_avx2(auVar5,auVar1);
  auVar2 = vpsubd_avx2(auVar6,auVar2);
  auVar3 = vpsubd_avx2(auVar11,auVar3);
  auVar4 = vpsubd_avx2(auVar7,auVar4);
  auVar5 = vpunpckldq_avx2((undefined1  [32])alVar12,auVar3);
  auVar6 = vpunpckldq_avx2(auVar1,auVar9);
  auVar3 = vpunpckhdq_avx2((undefined1  [32])alVar12,auVar3);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar9);
  auVar7 = vpunpckldq_avx2(auVar10,auVar4);
  auVar9 = vpunpckldq_avx2(auVar2,auVar8);
  auVar4 = vpunpckhdq_avx2(auVar10,auVar4);
  auVar2 = vpunpckhdq_avx2(auVar2,auVar8);
  auVar8 = vpunpcklqdq_avx2(auVar5,auVar6);
  auVar10 = vpunpcklqdq_avx2(auVar7,auVar9);
  auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhqdq_avx2(auVar7,auVar9);
  auVar7 = vpunpcklqdq_avx2(auVar3,auVar1);
  auVar9 = vpunpcklqdq_avx2(auVar4,auVar2);
  auVar1 = vpunpckhqdq_avx2(auVar3,auVar1);
  auVar2 = vpunpckhqdq_avx2(auVar4,auVar2);
  alVar12._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar8._0_16_;
  alVar12._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar10._0_16_;
  *in = alVar12;
  alVar12 = (__m256i)vperm2i128_avx2(auVar8,auVar10,0x31);
  in[1] = alVar12;
  alVar13._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
  alVar13._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
  in[2] = alVar13;
  alVar12 = (__m256i)vperm2i128_avx2(auVar5,auVar6,0x31);
  in[3] = alVar12;
  alVar14._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar7._0_16_;
  alVar14._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar9._0_16_;
  in[4] = alVar14;
  alVar12 = (__m256i)vperm2i128_avx2(auVar7,auVar9,0x31);
  in[5] = alVar12;
  alVar15._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar1._0_16_;
  alVar15._16_16_ = ZEXT116(0) * auVar1._16_16_ + ZEXT116(1) * auVar2._0_16_;
  in[6] = alVar15;
  alVar12 = (__m256i)vperm2i128_avx2(auVar1,auVar2,0x31);
  in[7] = alVar12;
  return;
}

Assistant:

static void highbd_hadamard_col8_avx2(__m256i *in, int iter) {
  __m256i a0 = in[0];
  __m256i a1 = in[1];
  __m256i a2 = in[2];
  __m256i a3 = in[3];
  __m256i a4 = in[4];
  __m256i a5 = in[5];
  __m256i a6 = in[6];
  __m256i a7 = in[7];

  __m256i b0 = _mm256_add_epi32(a0, a1);
  __m256i b1 = _mm256_sub_epi32(a0, a1);
  __m256i b2 = _mm256_add_epi32(a2, a3);
  __m256i b3 = _mm256_sub_epi32(a2, a3);
  __m256i b4 = _mm256_add_epi32(a4, a5);
  __m256i b5 = _mm256_sub_epi32(a4, a5);
  __m256i b6 = _mm256_add_epi32(a6, a7);
  __m256i b7 = _mm256_sub_epi32(a6, a7);

  a0 = _mm256_add_epi32(b0, b2);
  a1 = _mm256_add_epi32(b1, b3);
  a2 = _mm256_sub_epi32(b0, b2);
  a3 = _mm256_sub_epi32(b1, b3);
  a4 = _mm256_add_epi32(b4, b6);
  a5 = _mm256_add_epi32(b5, b7);
  a6 = _mm256_sub_epi32(b4, b6);
  a7 = _mm256_sub_epi32(b5, b7);

  if (iter == 0) {
    b0 = _mm256_add_epi32(a0, a4);
    b7 = _mm256_add_epi32(a1, a5);
    b3 = _mm256_add_epi32(a2, a6);
    b4 = _mm256_add_epi32(a3, a7);
    b2 = _mm256_sub_epi32(a0, a4);
    b6 = _mm256_sub_epi32(a1, a5);
    b1 = _mm256_sub_epi32(a2, a6);
    b5 = _mm256_sub_epi32(a3, a7);

    a0 = _mm256_unpacklo_epi32(b0, b1);
    a1 = _mm256_unpacklo_epi32(b2, b3);
    a2 = _mm256_unpackhi_epi32(b0, b1);
    a3 = _mm256_unpackhi_epi32(b2, b3);
    a4 = _mm256_unpacklo_epi32(b4, b5);
    a5 = _mm256_unpacklo_epi32(b6, b7);
    a6 = _mm256_unpackhi_epi32(b4, b5);
    a7 = _mm256_unpackhi_epi32(b6, b7);

    b0 = _mm256_unpacklo_epi64(a0, a1);
    b1 = _mm256_unpacklo_epi64(a4, a5);
    b2 = _mm256_unpackhi_epi64(a0, a1);
    b3 = _mm256_unpackhi_epi64(a4, a5);
    b4 = _mm256_unpacklo_epi64(a2, a3);
    b5 = _mm256_unpacklo_epi64(a6, a7);
    b6 = _mm256_unpackhi_epi64(a2, a3);
    b7 = _mm256_unpackhi_epi64(a6, a7);

    in[0] = _mm256_permute2x128_si256(b0, b1, 0x20);
    in[1] = _mm256_permute2x128_si256(b0, b1, 0x31);
    in[2] = _mm256_permute2x128_si256(b2, b3, 0x20);
    in[3] = _mm256_permute2x128_si256(b2, b3, 0x31);
    in[4] = _mm256_permute2x128_si256(b4, b5, 0x20);
    in[5] = _mm256_permute2x128_si256(b4, b5, 0x31);
    in[6] = _mm256_permute2x128_si256(b6, b7, 0x20);
    in[7] = _mm256_permute2x128_si256(b6, b7, 0x31);
  } else {
    in[0] = _mm256_add_epi32(a0, a4);
    in[7] = _mm256_add_epi32(a1, a5);
    in[3] = _mm256_add_epi32(a2, a6);
    in[4] = _mm256_add_epi32(a3, a7);
    in[2] = _mm256_sub_epi32(a0, a4);
    in[6] = _mm256_sub_epi32(a1, a5);
    in[1] = _mm256_sub_epi32(a2, a6);
    in[5] = _mm256_sub_epi32(a3, a7);
  }
}